

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knote.c
# Opt level: O0

int knote_delete(filter *filt,knote *kn)

{
  long in_RSI;
  long in_RDI;
  int rv;
  knote *tmp;
  knote query;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  knote_index *in_stack_ffffffffffffff38;
  knote *in_stack_ffffffffffffff48;
  knote_index *in_stack_ffffffffffffff50;
  int local_4;
  
  if ((*(uint *)(in_RSI + 0x20) & 0x80000000) == 0) {
    knote_index_RB_FIND(in_stack_ffffffffffffff38,
                        (knote *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    knote_index_RB_REMOVE(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    if ((*(long *)(in_RSI + 0x58) != 0) || (*(long *)(in_RSI + 0x60) != 0)) {
      if (*(long *)(in_RSI + 0x58) != 0) {
        *(undefined8 *)(*(long *)(in_RSI + 0x58) + 0x60) = *(undefined8 *)(in_RSI + 0x60);
      }
      **(undefined8 **)(in_RSI + 0x60) = *(undefined8 *)(in_RSI + 0x58);
      *(undefined8 *)(in_RSI + 0x58) = 0;
      *(undefined8 *)(in_RSI + 0x60) = 0;
    }
    local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,in_RSI);
    *(uint *)(in_RSI + 0x20) = *(uint *)(in_RSI + 0x20) | 0x80000000;
    knote_release((knote *)CONCAT44(local_4,in_stack_ffffffffffffff30));
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int
knote_delete(struct filter *filt, struct knote *kn)
{
    struct knote query;
    struct knote *tmp;
    int rv;

    dbg_printf("kn=%p - calling kn_delete", kn);
    if (kn->kn_flags & KNFL_KNOTE_DELETED) {
        dbg_printf("kn=%p - double deletion detected", kn);
        return (-1);
    }

    /*
     * Verify that the knote wasn't removed by another
     * thread before we acquired the knotelist lock.
     */
    query.kev.ident = kn->kev.ident;
    kqueue_mutex_assert(filt->kf_kqueue, MTX_LOCKED);
    tmp = RB_FIND(knote_index, &filt->kf_index, &query);
    if (tmp != kn)
        dbg_printf("kn=%p - conflicting entry in filter tree", kn);

    RB_REMOVE(knote_index, &filt->kf_index, kn);

    if (LIST_INSERTED(kn, kn_ready))
        LIST_REMOVE_ZERO(kn, kn_ready);

    rv = filt->kn_delete(filt, kn);
    dbg_printf("kn=%p - kn_delete rv=%i", kn, rv);

    kn->kn_flags |= KNFL_KNOTE_DELETED;
    knote_release(kn);

    return (rv);
}